

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall duckdb::ScanFilterInfo::CheckAllFilters(ScanFilterInfo *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ulong uVar37;
  bool *pbVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar43;
  undefined4 uVar45;
  undefined1 auVar44 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar68;
  int iVar69;
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  this->always_true_filters = 0;
  lVar3 = (long)(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p;
  uVar39 = ((long)(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_p - lVar3) * 8 +
           (ulong)*(uint *)((long)&(this->column_has_filter).
                                   super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (uVar39 != 0) {
    lVar4 = (long)(this->base_column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p;
    uVar37 = 0;
    do {
      uVar40 = uVar37 + 0x3f;
      if (-1 < (long)uVar37) {
        uVar40 = uVar37;
      }
      uVar42 = (ulong)((uVar37 & 0x800000000000003f) < 0x8000000000000001);
      uVar41 = 1L << ((byte)uVar37 & 0x3f);
      lVar2 = uVar42 * 8 + -8;
      lVar1 = lVar3 + ((long)uVar40 >> 6) * 8;
      if ((*(ulong *)(lVar4 + ((long)uVar40 >> 6) * 8 + -8 + uVar42 * 8) >> (uVar37 & 0x3f) & 1) ==
          0) {
        uVar41 = ~uVar41 & *(ulong *)(lVar1 + lVar2);
      }
      else {
        uVar41 = uVar41 | *(ulong *)(lVar1 + lVar2);
      }
      *(ulong *)(lVar1 + lVar2) = uVar41;
      uVar37 = uVar37 + 1;
    } while (uVar37 < uVar39);
  }
  auVar36 = _DAT_01da0bd0;
  auVar35 = _DAT_01da0bc0;
  auVar34 = _DAT_01da0bb0;
  auVar33 = _DAT_01da0ba0;
  auVar32 = _DAT_01da0b90;
  auVar31 = _DAT_01d9fb10;
  auVar30 = _DAT_01d9fb00;
  pSVar5 = (this->filter_list).super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
           .super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar6 = (this->filter_list).super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
           .super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar6) {
    uVar39 = (long)pSVar6 + (-0x28 - (long)pSVar5);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar39;
    uVar43 = SUB164(auVar66 * ZEXT816(0xcccccccccccccccd),8);
    uVar45 = (undefined4)(uVar39 / 0x140000000);
    auVar71._0_8_ = CONCAT44(uVar45,uVar43);
    auVar71._8_4_ = uVar43;
    auVar71._12_4_ = uVar45;
    auVar44._0_8_ = auVar71._0_8_ >> 5;
    auVar44._8_8_ = auVar71._8_8_ >> 5;
    pbVar38 = &pSVar5[0xf].always_true;
    uVar37 = 0;
    do {
      auVar63._8_4_ = (int)uVar37;
      auVar63._0_8_ = uVar37;
      auVar63._12_4_ = (int)(uVar37 >> 0x20);
      auVar66 = auVar44 ^ auVar31;
      auVar71 = (auVar63 | auVar30) ^ auVar31;
      iVar65 = auVar66._0_4_;
      iVar84 = -(uint)(iVar65 < auVar71._0_4_);
      iVar68 = auVar66._4_4_;
      auVar73._4_4_ = -(uint)(iVar68 < auVar71._4_4_);
      iVar69 = auVar66._8_4_;
      iVar88 = -(uint)(iVar69 < auVar71._8_4_);
      iVar70 = auVar66._12_4_;
      auVar73._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
      auVar55._4_4_ = iVar84;
      auVar55._0_4_ = iVar84;
      auVar55._8_4_ = iVar88;
      auVar55._12_4_ = iVar88;
      auVar66 = pshuflw(in_XMM1,auVar55,0xe8);
      auVar72._4_4_ = -(uint)(auVar71._4_4_ == iVar68);
      auVar72._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar55 = pshuflw(in_XMM2,auVar72,0xe8);
      auVar73._0_4_ = auVar73._4_4_;
      auVar73._8_4_ = auVar73._12_4_;
      auVar71 = pshuflw(auVar66,auVar73,0xe8);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar71 | auVar55 & auVar66) ^ auVar46;
      auVar66 = packssdw(auVar46,auVar46);
      if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar38[-600] = false;
      }
      auVar17._4_4_ = iVar84;
      auVar17._0_4_ = iVar84;
      auVar17._8_4_ = iVar88;
      auVar17._12_4_ = iVar88;
      auVar73 = auVar72 & auVar17 | auVar73;
      auVar66 = packssdw(auVar73,auVar73);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar7,auVar66 ^ auVar7);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._0_4_ >> 8 & 1) != 0) {
        pbVar38[-0x230] = false;
      }
      auVar66 = (auVar63 | auVar36) ^ auVar31;
      auVar56._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar56._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar56._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar56._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar74._4_4_ = auVar56._0_4_;
      auVar74._0_4_ = auVar56._0_4_;
      auVar74._8_4_ = auVar56._8_4_;
      auVar74._12_4_ = auVar56._8_4_;
      iVar84 = -(uint)(auVar66._4_4_ == iVar68);
      iVar88 = -(uint)(auVar66._12_4_ == iVar70);
      auVar18._4_4_ = iVar84;
      auVar18._0_4_ = iVar84;
      auVar18._8_4_ = iVar88;
      auVar18._12_4_ = iVar88;
      auVar85._4_4_ = auVar56._4_4_;
      auVar85._0_4_ = auVar56._4_4_;
      auVar85._8_4_ = auVar56._12_4_;
      auVar85._12_4_ = auVar56._12_4_;
      auVar66 = auVar18 & auVar74 | auVar85;
      auVar66 = packssdw(auVar66,auVar66);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar8,auVar66 ^ auVar8);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
        pbVar38[-0x208] = false;
      }
      auVar66 = pshufhw(auVar66,auVar74,0x84);
      auVar19._4_4_ = iVar84;
      auVar19._0_4_ = iVar84;
      auVar19._8_4_ = iVar88;
      auVar19._12_4_ = iVar88;
      auVar46 = pshufhw(auVar56,auVar19,0x84);
      auVar71 = pshufhw(auVar66,auVar85,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar71 | auVar46 & auVar66) ^ auVar47;
      auVar66 = packssdw(auVar47,auVar47);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._0_4_ >> 0x18 & 1) != 0) {
        pbVar38[-0x1e0] = false;
      }
      auVar66 = (auVar63 | auVar35) ^ auVar31;
      auVar57._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar57._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar57._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar57._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar20._4_4_ = auVar57._0_4_;
      auVar20._0_4_ = auVar57._0_4_;
      auVar20._8_4_ = auVar57._8_4_;
      auVar20._12_4_ = auVar57._8_4_;
      auVar46 = pshuflw(auVar85,auVar20,0xe8);
      auVar48._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
      auVar48._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
      auVar48._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
      auVar48._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
      auVar75._4_4_ = auVar48._4_4_;
      auVar75._0_4_ = auVar48._4_4_;
      auVar75._8_4_ = auVar48._12_4_;
      auVar75._12_4_ = auVar48._12_4_;
      auVar66 = pshuflw(auVar48,auVar75,0xe8);
      auVar76._4_4_ = auVar57._4_4_;
      auVar76._0_4_ = auVar57._4_4_;
      auVar76._8_4_ = auVar57._12_4_;
      auVar76._12_4_ = auVar57._12_4_;
      auVar71 = pshuflw(auVar57,auVar76,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 & auVar46,(auVar71 | auVar66 & auVar46) ^ auVar9);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar38[-0x1b8] = false;
      }
      auVar21._4_4_ = auVar57._0_4_;
      auVar21._0_4_ = auVar57._0_4_;
      auVar21._8_4_ = auVar57._8_4_;
      auVar21._12_4_ = auVar57._8_4_;
      auVar76 = auVar75 & auVar21 | auVar76;
      auVar71 = packssdw(auVar76,auVar76);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66,auVar71 ^ auVar10);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._4_2_ >> 8 & 1) != 0) {
        pbVar38[-400] = false;
      }
      auVar66 = (auVar63 | auVar34) ^ auVar31;
      auVar58._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar58._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar58._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar58._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar77._4_4_ = auVar58._0_4_;
      auVar77._0_4_ = auVar58._0_4_;
      auVar77._8_4_ = auVar58._8_4_;
      auVar77._12_4_ = auVar58._8_4_;
      iVar84 = -(uint)(auVar66._4_4_ == iVar68);
      iVar88 = -(uint)(auVar66._12_4_ == iVar70);
      auVar22._4_4_ = iVar84;
      auVar22._0_4_ = iVar84;
      auVar22._8_4_ = iVar88;
      auVar22._12_4_ = iVar88;
      auVar86._4_4_ = auVar58._4_4_;
      auVar86._0_4_ = auVar58._4_4_;
      auVar86._8_4_ = auVar58._12_4_;
      auVar86._12_4_ = auVar58._12_4_;
      auVar66 = auVar22 & auVar77 | auVar86;
      auVar66 = packssdw(auVar66,auVar66);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar11,auVar66 ^ auVar11);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar38[-0x168] = false;
      }
      auVar66 = pshufhw(auVar66,auVar77,0x84);
      auVar23._4_4_ = iVar84;
      auVar23._0_4_ = iVar84;
      auVar23._8_4_ = iVar88;
      auVar23._12_4_ = iVar88;
      auVar46 = pshufhw(auVar58,auVar23,0x84);
      auVar71 = pshufhw(auVar66,auVar86,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar71 | auVar46 & auVar66) ^ auVar49;
      auVar66 = packssdw(auVar49,auVar49);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._6_2_ >> 8 & 1) != 0) {
        pbVar38[-0x140] = false;
      }
      auVar66 = (auVar63 | auVar33) ^ auVar31;
      auVar59._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar59._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar59._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar59._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar24._4_4_ = auVar59._0_4_;
      auVar24._0_4_ = auVar59._0_4_;
      auVar24._8_4_ = auVar59._8_4_;
      auVar24._12_4_ = auVar59._8_4_;
      auVar46 = pshuflw(auVar86,auVar24,0xe8);
      auVar50._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
      auVar50._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
      auVar50._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
      auVar50._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
      auVar78._4_4_ = auVar50._4_4_;
      auVar78._0_4_ = auVar50._4_4_;
      auVar78._8_4_ = auVar50._12_4_;
      auVar78._12_4_ = auVar50._12_4_;
      auVar66 = pshuflw(auVar50,auVar78,0xe8);
      auVar79._4_4_ = auVar59._4_4_;
      auVar79._0_4_ = auVar59._4_4_;
      auVar79._8_4_ = auVar59._12_4_;
      auVar79._12_4_ = auVar59._12_4_;
      auVar71 = pshuflw(auVar59,auVar79,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar71 | auVar66 & auVar46) ^ auVar60;
      auVar71 = packssdw(auVar60,auVar60);
      auVar66 = packsswb(auVar66 & auVar46,auVar71);
      if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar38[-0x118] = false;
      }
      auVar25._4_4_ = auVar59._0_4_;
      auVar25._0_4_ = auVar59._0_4_;
      auVar25._8_4_ = auVar59._8_4_;
      auVar25._12_4_ = auVar59._8_4_;
      auVar79 = auVar78 & auVar25 | auVar79;
      auVar71 = packssdw(auVar79,auVar79);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar71 = packssdw(auVar71 ^ auVar12,auVar71 ^ auVar12);
      auVar66 = packsswb(auVar66,auVar71);
      if ((auVar66._8_2_ >> 8 & 1) != 0) {
        pbVar38[-0xf0] = false;
      }
      auVar66 = (auVar63 | auVar32) ^ auVar31;
      auVar61._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar61._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar61._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar61._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar80._4_4_ = auVar61._0_4_;
      auVar80._0_4_ = auVar61._0_4_;
      auVar80._8_4_ = auVar61._8_4_;
      auVar80._12_4_ = auVar61._8_4_;
      iVar84 = -(uint)(auVar66._4_4_ == iVar68);
      iVar88 = -(uint)(auVar66._12_4_ == iVar70);
      auVar26._4_4_ = iVar84;
      auVar26._0_4_ = iVar84;
      auVar26._8_4_ = iVar88;
      auVar26._12_4_ = iVar88;
      auVar87._4_4_ = auVar61._4_4_;
      auVar87._0_4_ = auVar61._4_4_;
      auVar87._8_4_ = auVar61._12_4_;
      auVar87._12_4_ = auVar61._12_4_;
      auVar66 = auVar26 & auVar80 | auVar87;
      auVar66 = packssdw(auVar66,auVar66);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar13,auVar66 ^ auVar13);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar38[-200] = false;
      }
      auVar66 = pshufhw(auVar66,auVar80,0x84);
      auVar27._4_4_ = iVar84;
      auVar27._0_4_ = iVar84;
      auVar27._8_4_ = iVar88;
      auVar27._12_4_ = iVar88;
      auVar46 = pshufhw(auVar61,auVar27,0x84);
      auVar71 = pshufhw(auVar66,auVar87,0x84);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar51 = (auVar71 | auVar46 & auVar66) ^ auVar51;
      auVar66 = packssdw(auVar51,auVar51);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._10_2_ >> 8 & 1) != 0) {
        pbVar38[-0xa0] = false;
      }
      auVar66 = (auVar63 | _DAT_01da0b80) ^ auVar31;
      auVar62._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar62._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar62._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar62._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar28._4_4_ = auVar62._0_4_;
      auVar28._0_4_ = auVar62._0_4_;
      auVar28._8_4_ = auVar62._8_4_;
      auVar28._12_4_ = auVar62._8_4_;
      auVar46 = pshuflw(auVar87,auVar28,0xe8);
      auVar52._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
      auVar52._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
      auVar52._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
      auVar52._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
      auVar81._4_4_ = auVar52._4_4_;
      auVar81._0_4_ = auVar52._4_4_;
      auVar81._8_4_ = auVar52._12_4_;
      auVar81._12_4_ = auVar52._12_4_;
      auVar66 = pshuflw(auVar52,auVar81,0xe8);
      auVar82._4_4_ = auVar62._4_4_;
      auVar82._0_4_ = auVar62._4_4_;
      auVar82._8_4_ = auVar62._12_4_;
      auVar82._12_4_ = auVar62._12_4_;
      auVar71 = pshuflw(auVar62,auVar82,0xe8);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 & auVar46,(auVar71 | auVar66 & auVar46) ^ auVar14);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar38[-0x78] = false;
      }
      auVar29._4_4_ = auVar62._0_4_;
      auVar29._0_4_ = auVar62._0_4_;
      auVar29._8_4_ = auVar62._8_4_;
      auVar29._12_4_ = auVar62._8_4_;
      auVar82 = auVar81 & auVar29 | auVar82;
      auVar71 = packssdw(auVar82,auVar82);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66,auVar71 ^ auVar15);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66._12_2_ >> 8 & 1) != 0) {
        pbVar38[-0x50] = false;
      }
      auVar66 = (auVar63 | _DAT_01da0b70) ^ auVar31;
      auVar53._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
      auVar53._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
      auVar53._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
      auVar53._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
      auVar83._4_4_ = auVar53._0_4_;
      auVar83._0_4_ = auVar53._0_4_;
      auVar83._8_4_ = auVar53._8_4_;
      auVar83._12_4_ = auVar53._8_4_;
      auVar64._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
      auVar64._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar67._4_4_ = auVar53._4_4_;
      auVar67._0_4_ = auVar53._4_4_;
      auVar67._8_4_ = auVar53._12_4_;
      auVar67._12_4_ = auVar53._12_4_;
      auVar71 = auVar64 & auVar83 | auVar67;
      auVar66 = packssdw(auVar53,auVar71);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar16,auVar66 ^ auVar16);
      auVar66 = packsswb(auVar66,auVar66);
      if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar38[-0x28] = false;
      }
      auVar66 = pshufhw(auVar66,auVar83,0x84);
      auVar71 = pshufhw(auVar71,auVar64,0x84);
      in_XMM2 = auVar71 & auVar66;
      auVar66 = pshufhw(auVar66,auVar67,0x84);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar66 | in_XMM2) ^ auVar54;
      auVar66 = packssdw(auVar54,auVar54);
      in_XMM1 = packsswb(auVar66,auVar66);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *pbVar38 = false;
      }
      uVar37 = uVar37 + 0x10;
      pbVar38 = pbVar38 + 0x280;
    } while ((uVar39 / 0x28 + 0x10 & 0xfffffffffffffff0) != uVar37);
  }
  return;
}

Assistant:

void ScanFilterInfo::CheckAllFilters() {
	always_true_filters = 0;
	// reset the "column_has_filter" bitmask to the original
	for (idx_t col_idx = 0; col_idx < column_has_filter.size(); col_idx++) {
		column_has_filter[col_idx] = base_column_has_filter[col_idx];
	}
	// set "always_true" in the individual filters to false
	for (auto &filter : filter_list) {
		filter.always_true = false;
	}
}